

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpbyteaddress.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPByteAddress::IsFromSameHost(RTPByteAddress *this,RTPAddress *addr)

{
  AddressType AVar1;
  int iVar2;
  RTPByteAddress *addr2;
  RTPAddress *addr_local;
  RTPByteAddress *this_local;
  
  if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == ByteAddress) {
      if (addr[9]._vptr_RTPAddress == (_func_int **)this->addresslength) {
        if ((this->addresslength != 0) &&
           (iVar2 = memcmp(&(this->super_RTPAddress).field_0xc,&addr->field_0xc,this->addresslength)
           , iVar2 != 0)) {
          return false;
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTPByteAddress::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != ByteAddress)
		return false;

	const RTPByteAddress *addr2 = (const RTPByteAddress *)addr;
	
	if (addr2->addresslength != addresslength)
		return false;
	if (addresslength == 0 || (memcmp(hostaddress, addr2->hostaddress, addresslength) == 0))
		return true;
	return false;
}